

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix3.c
# Opt level: O0

char * test_matrix3_zero(void)

{
  short sVar1;
  byte local_59;
  undefined1 local_58 [7];
  uint8_t i;
  matrix3 zero;
  
  matrix3_zero((matrix3 *)local_58);
  local_59 = 0;
  while( true ) {
    if (8 < local_59) {
      return (char *)0x0;
    }
    sVar1 = scalar_equalsf(*(double *)(local_58 + (ulong)local_59 * 8),0.0);
    if (sVar1 == 0) break;
    local_59 = local_59 + 1;
  }
  return 
  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix3.c(11) : (assertion failed) ((scalar_equalsf(zero.m[i], 0.0f)))"
  ;
}

Assistant:

static char *test_matrix3_zero(void)
{
	struct matrix3 zero;
	uint8_t i;

	matrix3_zero(&zero);

	for (i = 0; i < 9; i++) {
		test_assert(scalar_equalsf(zero.m[i], 0.0f));
	}

	return NULL;
}